

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_render_pass_fragment_density_map
          (Impl *this,Value *state,VkRenderPassFragmentDensityMapCreateInfoEXT **out_info)

{
  uint uVar1;
  VkImageLayout VVar2;
  VkRenderPassFragmentDensityMapCreateInfoEXT *pVVar3;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar4;
  Type pGVar5;
  VkRenderPassFragmentDensityMapCreateInfoEXT *info;
  VkRenderPassFragmentDensityMapCreateInfoEXT **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkRenderPassFragmentDensityMapCreateInfoEXT>
                     (&this->allocator);
  pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)state,"fragmentDensityMapAttachment");
  pGVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(pGVar4,"attachment");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar5);
  (pVVar3->fragmentDensityMapAttachment).attachment = uVar1;
  pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)state,"fragmentDensityMapAttachment");
  pGVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(pGVar4,"layout");
  VVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar5);
  (pVVar3->fragmentDensityMapAttachment).layout = VVar2;
  *out_info = pVVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_render_pass_fragment_density_map(const Value &state, VkRenderPassFragmentDensityMapCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkRenderPassFragmentDensityMapCreateInfoEXT>();
	info->fragmentDensityMapAttachment.attachment = state["fragmentDensityMapAttachment"]["attachment"].GetUint();
	info->fragmentDensityMapAttachment.layout = static_cast<VkImageLayout>(state["fragmentDensityMapAttachment"]["layout"].GetUint());
	*out_info = info;
	return true;
}